

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

size_t sorter_quick_sort_partition(int64_t *dst,size_t left,size_t right,size_t pivot)

{
  int64_t iVar1;
  int64_t iVar2;
  uint uVar3;
  int64_t _sort_swap_temp_2;
  int64_t _sort_swap_temp_1;
  int cmp;
  int64_t _sort_swap_temp;
  int not_all_same;
  size_t i;
  size_t index;
  int64_t value;
  size_t pivot_local;
  size_t right_local;
  size_t left_local;
  int64_t *dst_local;
  size_t local_8;
  
  iVar1 = dst[pivot];
  not_all_same = 0;
  iVar2 = dst[pivot];
  dst[pivot] = dst[right];
  dst[right] = iVar2;
  index = left;
  for (i = left; i < right; i = i + 1) {
    uVar3 = (int)dst[i] - (int)iVar1;
    not_all_same = uVar3 | not_all_same;
    if ((int)uVar3 < 0) {
      iVar2 = dst[i];
      dst[i] = dst[index];
      dst[index] = iVar2;
      index = index + 1;
    }
  }
  iVar1 = dst[right];
  dst[right] = dst[index];
  dst[index] = iVar1;
  if (not_all_same == 0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = index;
  }
  return local_8;
}

Assistant:

static __inline size_t QUICK_SORT_PARTITION(SORT_TYPE *dst, const size_t left,
                                            const size_t right,
                                            const size_t pivot) {
  SORT_TYPE value = dst[pivot];
  size_t index = left;
  size_t i;
  int not_all_same = 0;
  /* move the pivot to the right */
  SORT_SWAP(dst[pivot], dst[right]);

  for (i = left; i < right; i++) {
    int cmp = SORT_CMP(dst[i], value);
    /* check if everything is all the same */
    not_all_same |= cmp;

    if (cmp < 0) {
      SORT_SWAP(dst[i], dst[index]);
      index++;
    }
  }

  SORT_SWAP(dst[right], dst[index]);

  /* avoid degenerate case */
  if (not_all_same == 0) {
    return SIZE_MAX;
  }

  return index;
}